

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

ResendRequest *
anon_unknown.dwarf_334836::createResendRequest
          (ResendRequest *__return_storage_ptr__,char *sender,char *target,int seq,int begin,int end
          )

{
  undefined1 *this;
  int iVar1;
  FieldBase FStack_78;
  
  FIX42::ResendRequest::ResendRequest(__return_storage_ptr__);
  FIX::BeginSeqNo::BeginSeqNo((BeginSeqNo *)&FStack_78,(ulong)target & 0xffffffff);
  FIX42::ResendRequest::set(__return_storage_ptr__,(BeginSeqNo *)&FStack_78);
  FIX::FieldBase::~FieldBase(&FStack_78);
  FIX::EndSeqNo::EndSeqNo((EndSeqNo *)&FStack_78,(ulong)(uint)seq);
  FIX42::ResendRequest::set(__return_storage_ptr__,(EndSeqNo *)&FStack_78);
  FIX::FieldBase::~FieldBase(&FStack_78);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&FStack_78,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&FStack_78,true);
  FIX::FieldBase::~FieldBase(&FStack_78);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&FStack_78,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&FStack_78,true);
  FIX::FieldBase::~FieldBase(&FStack_78);
  return __return_storage_ptr__;
}

Assistant:

FIX42::ResendRequest createResendRequest(const char *sender, const char *target, int seq, int begin, int end) {
  FIX42::ResendRequest resendRequest;
  resendRequest.set(BeginSeqNo(begin));
  resendRequest.set(EndSeqNo(end));
  fillHeader(resendRequest.getHeader(), sender, target, seq);
  resendRequest.getHeader().setField(BodyLength(resendRequest.bodyLength()));
  resendRequest.getTrailer().setField(CheckSum(resendRequest.checkSum()));
  return resendRequest;
}